

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationObject.cpp
# Opt level: O2

void __thiscall Js::ActivationObjectEx::InvalidateCachedScope(ActivationObjectEx *this)

{
  if ((ulong)this->cachedFuncCount != 0) {
    memset(this->cache,0,(ulong)this->cachedFuncCount << 4);
  }
  Memory::WriteBarrierPtr<Js::ActivationObjectEx>::WriteBarrierSet
            (&((this->parentFunc).ptr)->cachedScopeObj,(ActivationObjectEx *)0x0);
  return;
}

Assistant:

void ActivationObjectEx::InvalidateCachedScope()
    {
        if (this->cachedFuncCount != 0)
        {
            // Clearing the cached functions and types isn't strictly necessary for correctness,
            // but we want those objects to be collected even if the scope object is part of someone's
            // closure environment.
            memset(this->cache, 0, this->cachedFuncCount * sizeof(FuncCacheEntry));
        }
        this->parentFunc->SetCachedScope(nullptr);
    }